

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

string * __thiscall
SceneW::writeXml_abi_cxx11_(string *__return_storage_ptr__,SceneW *this,int indent)

{
  pointer ppWVar1;
  Widget *pWVar2;
  ostream *poVar3;
  int level;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  int i;
  ulong uVar4;
  stringstream str;
  string sStack_238;
  string local_218;
  string local_1f8 [32];
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Util::getIndent_abi_cxx11_(&sStack_238,(Util *)(ulong)(uint)indent,level);
  poVar3 = std::operator<<(local_1a8,(string *)&sStack_238);
  std::operator<<(poVar3,"<Scene");
  std::__cxx11::string::~string((string *)&sStack_238);
  std::__cxx11::string::string(local_1f8,"title",(allocator *)&sStack_238);
  std::__cxx11::string::string((string *)&local_218,(string *)&this->title);
  Util::writeXmlAttribute<std::__cxx11::string>
            (&local_1d8,(Util *)local_1b8,(stringstream *)local_1f8,&local_218,in_R8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string(local_1f8);
  Widget::writeXmlAttributes(&this->super_Widget,(stringstream *)local_1b8);
  poVar3 = std::operator<<(local_1a8,">");
  std::endl<char,std::char_traits<char>>(poVar3);
  uVar4 = 0;
  while( true ) {
    ppWVar1 = (this->super_Widget).children.super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->super_Widget).children.
                      super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppWVar1 >> 3) <= uVar4) break;
    pWVar2 = ppWVar1[uVar4];
    (**pWVar2->_vptr_Widget)(&sStack_238,pWVar2,(ulong)(indent + 1));
    poVar3 = std::operator<<(local_1a8,(string *)&sStack_238);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&sStack_238);
    uVar4 = uVar4 + 1;
  }
  std::operator<<(local_1a8,"</Scene>");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string SceneW::writeXml(int indent)
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<Scene";

	Util::writeXmlAttribute(str, "title", title);
	writeXmlAttributes(str);

	str << ">" << std::endl;

	for (int i = 0; i < children.size(); i++)
	{
		str << children[i]->writeXml(indent + 1) << std::endl;
	}

	str << "</Scene>";
	return str.str();
}